

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalSubtractOverflowCheck,bool>
               (long *ldata,long *rdata,long *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  unsigned_long *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  bool bVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  ulong uVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  OutOfRangeException *pOVar13;
  ulong uVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  long lVar16;
  string local_78;
  long *local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  long *local_48;
  long *local_40;
  idx_t local_38;
  
  local_58 = ldata;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar15 = 0;
      do {
        uVar11 = uVar15;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar15];
        }
        uVar14 = uVar15;
        if (psVar3 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar3[uVar15];
        }
        lVar4 = ldata[uVar11];
        lVar5 = rdata[uVar14];
        if (lVar5 < 0) {
          lVar16 = lVar5 + 999999999999999999;
          if (lVar16 < lVar4) goto LAB_0147b9cc;
LAB_0147b9da:
          lVar16 = lVar4 - lVar5;
          bVar8 = true;
        }
        else {
          lVar16 = lVar5 + -999999999999999999;
          if (lVar16 <= lVar4) goto LAB_0147b9da;
LAB_0147b9cc:
          bVar8 = false;
        }
        if (!bVar8) {
          pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<long,long>(pOVar13,&local_78,lVar4,lVar5);
          __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[uVar15] = lVar16;
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar15 = 0;
    local_48 = result_data;
    local_40 = rdata;
    do {
      uVar11 = uVar15;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar15];
      }
      uVar14 = uVar15;
      if (psVar3 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar3[uVar15];
      }
      puVar6 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
         && ((puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))
         ) {
        lVar4 = local_58[uVar11];
        lVar5 = rdata[uVar14];
        if (lVar5 < 0) {
          lVar16 = lVar5 + 999999999999999999;
          if (lVar16 < lVar4) goto LAB_0147ba9f;
LAB_0147bb54:
          lVar16 = lVar4 - lVar5;
          bVar8 = true;
        }
        else {
          lVar16 = lVar5 + -999999999999999999;
          if (lVar16 <= lVar4) goto LAB_0147bb54;
LAB_0147ba9f:
          bVar8 = false;
        }
        if (!bVar8) {
          pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<long,long>(pOVar13,&local_78,lVar4,lVar5);
          __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[uVar15] = lVar16;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          sVar10 = local_78._M_string_length;
          _Var9._M_p = local_78._M_dataplus._M_p;
          local_78._M_dataplus._M_p = (pointer)0x0;
          local_78._M_string_length = 0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var9._M_p;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_50);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          result_data = local_48;
          rdata = local_40;
        }
        bVar7 = (byte)uVar15 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}